

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O0

bool __thiscall
Diligent::DearchiverBase::UnpackPSOShaders<Diligent::ComputePipelineStateCreateInfo>
          (DearchiverBase *this,ArchiveData *Archive,
          PSOData<Diligent::ComputePipelineStateCreateInfo> *PSO,IRenderDevice *pDevice)

{
  TPointer puVar1;
  undefined *puVar2;
  bool bVar3;
  DeviceType DevType_00;
  PSO_CREATE_INTERNAL_FLAGS PVar4;
  Char *pCVar5;
  pointer pDVar6;
  SerializedData *this_00;
  IMemoryAllocator *Allocator_00;
  undefined8 uVar7;
  reference __m;
  RefCntAutoPtr *this_01;
  char (*pacVar8) [20];
  char (*Args_1) [20];
  reference pvVar9;
  ulong uVar10;
  size_type sVar11;
  IRenderDevice *Args_1_00;
  undefined1 local_248 [8];
  unique_lock<std::mutex> WriteLock;
  undefined1 local_230 [8];
  string msg_2;
  string _msg_1;
  Serializer<(Diligent::SerializerMode)0> ShaderSer;
  ShaderCreateInfo ShaderCI;
  SerializedData *SerializedShader;
  unique_lock<std::mutex> ReadLock;
  Uint32 Idx;
  RefCntAutoPtr<Diligent::IShader> *pShader;
  Uint32 i;
  ShaderCacheData *ShaderCache;
  string msg_1;
  undefined1 local_e0 [8];
  string _msg;
  Serializer<(Diligent::SerializerMode)0> Ser;
  ShaderIndexArray ShaderIndices;
  DynamicLinearAllocator Allocator;
  SerializedData *ShaderIdxData;
  DeviceType DevType;
  undefined1 local_58 [8];
  string msg;
  unique_ptr<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
  *pObjArchive;
  IRenderDevice *pDevice_local;
  PSOData<Diligent::ComputePipelineStateCreateInfo> *PSO_local;
  ArchiveData *Archive_local;
  DearchiverBase *this_local;
  
  Args_1_00 = pDevice;
  msg.field_2._8_8_ = Archive;
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)Archive);
  if (!bVar3) {
    FormatString<char[26],char[12]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pObjArchive",(char (*) [12])Args_1_00);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"UnpackPSOShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x19d);
    std::__cxx11::string::~string((string *)local_58);
  }
  DevType_00 = GetArchiveDeviceType(pDevice);
  pDVar6 = std::
           unique_ptr<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
           ::operator->((unique_ptr<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                         *)msg.field_2._8_8_);
  this_00 = DeviceObjectArchive::GetDeviceSpecificData
                      (pDVar6,ComputePipeline,
                       (PSO->CreateInfo).super_PipelineStateCreateInfo.PSODesc.
                       super_DeviceObjectAttribs.Name,DevType_00);
  bVar3 = SerializedData::operator_cast_to_bool(this_00);
  if (bVar3) {
    Allocator_00 = GetRawAllocator();
    DynamicLinearAllocator::DynamicLinearAllocator
              ((DynamicLinearAllocator *)&ShaderIndices.Count,Allocator_00,0x1000);
    DeviceObjectArchive::ShaderIndexArray::ShaderIndexArray((ShaderIndexArray *)&Ser.m_Ptr);
    Serializer<(Diligent::SerializerMode)0>::Serializer
              ((Serializer<(Diligent::SerializerMode)0> *)((long)&_msg.field_2 + 8),this_00);
    bVar3 = PSOSerializer<(Diligent::SerializerMode)0>::SerializeShaderIndices
                      ((Serializer<(Diligent::SerializerMode)0> *)((long)&_msg.field_2 + 8),
                       (ConstQual<ShaderIndexArray> *)&Ser.m_Ptr,
                       (DynamicLinearAllocator *)&ShaderIndices.Count);
    if (bVar3) {
      bVar3 = Serializer<(Diligent::SerializerMode)0>::IsEnded
                        ((Serializer<(Diligent::SerializerMode)0> *)((long)&_msg.field_2 + 8));
      if (!bVar3) {
        FormatString<char[49]>
                  ((string *)&ShaderCache,
                   (char (*) [49])"No other data besides shader indices is expected");
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"UnpackPSOShaders",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                   ,0x1ad);
        std::__cxx11::string::~string((string *)&ShaderCache);
      }
      __m = std::array<Diligent::DearchiverBase::ShaderCacheData,_7UL>::operator[]
                      (&Archive->CachedShaders,(ulong)DevType_00);
      std::
      vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
      ::resize(&PSO->Shaders,(ulong)(uint)ShaderIndices.pIndices);
      for (pShader._4_4_ = 0; pShader._4_4_ < (uint)ShaderIndices.pIndices;
          pShader._4_4_ = pShader._4_4_ + 1) {
        this_01 = (RefCntAutoPtr *)
                  std::
                  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                  ::operator[](&PSO->Shaders,(ulong)pShader._4_4_);
        puVar1 = Ser.m_Ptr + (ulong)pShader._4_4_ * 4;
        ReadLock._12_1_ = puVar1[0];
        ReadLock._13_1_ = puVar1[1];
        ReadLock._14_1_ = puVar1[2];
        ReadLock._15_1_ = puVar1[3];
        std::unique_lock<std::mutex>::unique_lock
                  ((unique_lock<std::mutex> *)&SerializedShader,&__m->Mtx);
        pacVar8 = (char (*) [20])(ulong)(uint)ReadLock._12_4_;
        Args_1 = (char (*) [20])
                 std::
                 vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                 ::size(&__m->Shaders);
        if (pacVar8 < Args_1) {
          pvVar9 = std::
                   vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                   ::operator[](&__m->Shaders,(ulong)(uint)ReadLock._12_4_);
          RefCntAutoPtr<Diligent::IShader>::operator=
                    ((RefCntAutoPtr<Diligent::IShader> *)this_01,pvVar9);
          bVar3 = Diligent::RefCntAutoPtr::operator_cast_to_bool(this_01);
          if (!bVar3) goto LAB_00721e78;
          msg_1.field_2._12_4_ = 0xe;
        }
        else {
LAB_00721e78:
          msg_1.field_2._12_4_ = 0;
        }
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&SerializedShader);
        if (msg_1.field_2._12_4_ == 0) {
          pDVar6 = std::
                   unique_ptr<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                   ::operator->((unique_ptr<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                                 *)msg.field_2._8_8_);
          ShaderCI.WebGPUEmulatedArrayIndexSuffix =
               (char *)DeviceObjectArchive::GetSerializedShader
                                 (pDVar6,DevType_00,(ulong)(uint)ReadLock._12_4_);
          bVar3 = SerializedData::operator_cast_to_bool
                            ((SerializedData *)ShaderCI.WebGPUEmulatedArrayIndexSuffix);
          if (!bVar3) {
            this_local._7_1_ = false;
            goto LAB_007221de;
          }
          ShaderCreateInfo::ShaderCreateInfo((ShaderCreateInfo *)&ShaderSer.m_Ptr);
          Serializer<(Diligent::SerializerMode)0>::Serializer
                    ((Serializer<(Diligent::SerializerMode)0> *)((long)&_msg_1.field_2 + 8),
                     (SerializedData *)ShaderCI.WebGPUEmulatedArrayIndexSuffix);
          bVar3 = ShaderSerializer<(Diligent::SerializerMode)0>::SerializeCI
                            ((Serializer<(Diligent::SerializerMode)0> *)((long)&_msg_1.field_2 + 8),
                             (ConstQual<ShaderCreateInfo> *)&ShaderSer.m_Ptr);
          if (!bVar3) {
            FormatString<char[84]>
                      ((string *)((long)&msg_2.field_2 + 8),
                       (char (*) [84])
                       "Failed to deserialize shader create info. Archive file may be corrupted or invalid."
                      );
            puVar2 = DebugMessageCallback;
            if (DebugMessageCallback != (undefined *)0x0) {
              uVar7 = std::__cxx11::string::c_str();
              (*(code *)puVar2)(2,uVar7,0);
            }
            std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
            this_local._7_1_ = false;
            goto LAB_007221de;
          }
          bVar3 = Serializer<(Diligent::SerializerMode)0>::IsEnded
                            ((Serializer<(Diligent::SerializerMode)0> *)((long)&_msg_1.field_2 + 8))
          ;
          if (!bVar3) {
            FormatString<char[26],char[20]>
                      ((string *)local_230,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"ShaderSer.IsEnded()",Args_1);
            pCVar5 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar5,"UnpackPSOShaders",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                       ,0x1d1);
            std::__cxx11::string::~string((string *)local_230);
          }
          PVar4 = Diligent::operator&((PSO->InternalCI).Flags,PSO_CREATE_INTERNAL_FLAG_LAST);
          if (PVar4 != PSO_CREATE_INTERNAL_FLAG_NONE) {
            Diligent::operator|=(&ShaderCI.MSLVersion.Major,SHADER_COMPILE_FLAG_SKIP_REFLECTION);
          }
          (*(this->super_ObjectBase<Diligent::IDearchiver>).
            super_RefCountedObject<Diligent::IDearchiver>.super_IDearchiver.super_IObject.
            _vptr_IObject[0xf])(&WriteLock._M_owns,this,&ShaderSer.m_Ptr,pDevice);
          RefCntAutoPtr<Diligent::IShader>::operator=
                    ((RefCntAutoPtr<Diligent::IShader> *)this_01,
                     (RefCntAutoPtr<Diligent::IShader> *)&WriteLock._M_owns);
          RefCntAutoPtr<Diligent::IShader>::~RefCntAutoPtr
                    ((RefCntAutoPtr<Diligent::IShader> *)&WriteLock._M_owns);
          bVar3 = RefCntAutoPtr<Diligent::IShader>::operator!
                            ((RefCntAutoPtr<Diligent::IShader> *)this_01);
          if (bVar3) {
            this_local._7_1_ = false;
            goto LAB_007221de;
          }
          std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_248,&__m->Mtx);
          uVar10 = (ulong)(uint)ReadLock._12_4_;
          sVar11 = std::
                   vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                   ::size(&__m->Shaders);
          if (sVar11 <= uVar10) {
            std::
            vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
            ::resize(&__m->Shaders,(ulong)(uint)ReadLock._12_4_ + 1);
          }
          pvVar9 = std::
                   vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                   ::operator[](&__m->Shaders,(ulong)(uint)ReadLock._12_4_);
          RefCntAutoPtr<Diligent::IShader>::operator=
                    (pvVar9,(RefCntAutoPtr<Diligent::IShader> *)this_01);
          std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_248);
        }
      }
      this_local._7_1_ = true;
    }
    else {
      FormatString<char[84]>
                ((string *)local_e0,
                 (char (*) [84])
                 "Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid."
                );
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar7 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar7,0);
      }
      std::__cxx11::string::~string((string *)local_e0);
      this_local._7_1_ = false;
    }
LAB_007221de:
    msg_1.field_2._12_4_ = 1;
    DynamicLinearAllocator::~DynamicLinearAllocator((DynamicLinearAllocator *)&ShaderIndices.Count);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DearchiverBase::UnpackPSOShaders(ArchiveData&             Archive,
                                      PSOData<CreateInfoType>& PSO,
                                      IRenderDevice*           pDevice)
{
    const auto& pObjArchive = Archive.pObjArchive;
    VERIFY_EXPR(pObjArchive);
    const DeviceType      DevType       = GetArchiveDeviceType(pDevice);
    const SerializedData& ShaderIdxData = pObjArchive->GetDeviceSpecificData(PSO.ArchiveResType, PSO.CreateInfo.PSODesc.Name, DevType);
    if (!ShaderIdxData)
        return false;

    DynamicLinearAllocator Allocator{GetRawAllocator()};

    DeviceObjectArchive::ShaderIndexArray ShaderIndices;
    {
        Serializer<SerializerMode::Read> Ser{ShaderIdxData};
        if (!PSOSerializer<SerializerMode::Read>::SerializeShaderIndices(Ser, ShaderIndices, &Allocator))
        {
            LOG_ERROR_MESSAGE("Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid.");
            return false;
        }
        VERIFY(Ser.IsEnded(), "No other data besides shader indices is expected");
    }

    ShaderCacheData& ShaderCache = Archive.CachedShaders[static_cast<size_t>(DevType)];

    PSO.Shaders.resize(ShaderIndices.Count);
    for (Uint32 i = 0; i < ShaderIndices.Count; ++i)
    {
        RefCntAutoPtr<IShader>& pShader{PSO.Shaders[i]};

        const Uint32 Idx = ShaderIndices.pIndices[i];

        {
            std::unique_lock<std::mutex> ReadLock{ShaderCache.Mtx};
            if (Idx < ShaderCache.Shaders.size())
            {
                // Try to get cached shader
                pShader = ShaderCache.Shaders[Idx];
                if (pShader)
                    continue;
            }
        }

        const SerializedData& SerializedShader = pObjArchive->GetSerializedShader(DevType, Idx);
        if (!SerializedShader)
            return false;

        {
            ShaderCreateInfo ShaderCI;
            {
                Serializer<SerializerMode::Read> ShaderSer{SerializedShader};
                if (!ShaderSerializer<SerializerMode::Read>::SerializeCI(ShaderSer, ShaderCI))
                {
                    LOG_ERROR_MESSAGE("Failed to deserialize shader create info. Archive file may be corrupted or invalid.");
                    return false;
                }
                VERIFY_EXPR(ShaderSer.IsEnded());
            }

            if ((PSO.InternalCI.Flags & PSO_CREATE_INTERNAL_FLAG_NO_SHADER_REFLECTION) != 0)
                ShaderCI.CompileFlags |= SHADER_COMPILE_FLAG_SKIP_REFLECTION;

            pShader = UnpackShader(ShaderCI, pDevice);
            if (!pShader)
                return false;
        }

        // Add to the cache
        {
            std::unique_lock<std::mutex> WriteLock{ShaderCache.Mtx};
            if (Idx >= ShaderCache.Shaders.size())
                ShaderCache.Shaders.resize(size_t{Idx} + 1);
            ShaderCache.Shaders[Idx] = pShader;
        }
    }

    return true;
}